

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

Polynomial<double> *
rtb::Filter::multiply<double>
          (Polynomial<double> *__return_storage_ptr__,Polynomial<double> *p1,Polynomial<double> *p2)

{
  size_t sVar1;
  size_type sVar2;
  double dVar3;
  pointer pcVar4;
  complex<double> *__z;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> resultCoefficients;
  Polynomial<double> polyResult;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> temp2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> temp1;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  it;
  allocator_type local_c1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_c0;
  Polynomial<double> local_a8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_80;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_68;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_50;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_48;
  
  sVar1 = p2->order_ + p1->order_;
  sVar2 = p2->order_ + 1 + p1->order_;
  local_a8.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&__return_storage_ptr__->coefficients_,sVar2,(value_type *)&local_a8,
             (allocator_type *)&local_c0);
  __return_storage_ptr__->order_ = sVar1;
  __return_storage_ptr__->size_ = sVar2;
  if (sVar1 == 0) {
    pcVar4 = (p1->coefficients_).
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((p1->coefficients_).
         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish != pcVar4) &&
       (__z = (p2->coefficients_).
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start,
       (p2->coefficients_).
       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
       super__Vector_impl_data._M_finish != __z)) {
      local_a8.coefficients_.
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)pcVar4->_M_value;
      local_a8.coefficients_.
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = *(pointer *)(pcVar4->_M_value + 8);
      std::complex<double>::operator*=((complex<double> *)&local_a8,__z);
      pcVar4 = (__return_storage_ptr__->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->coefficients_).
          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar4) {
        *(pointer *)pcVar4->_M_value =
             local_a8.coefficients_.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)(pcVar4->_M_value + 8) =
             local_a8.coefficients_.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        return __return_storage_ptr__;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  sVar2 = sVar1 * 2 + 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_c0,sVar2,(allocator_type *)&local_a8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_68,sVar2,(allocator_type *)&local_a8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_80,sVar2,(allocator_type *)&local_a8);
  if (p1->size_ != 0) {
    uVar6 = 1;
    uVar8 = 0;
    do {
      pcVar4 = (p1->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(p1->coefficients_).
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar4 >> 4) <= uVar8)
         || ((ulong)((long)local_68.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_68.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar8)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pcVar4 = pcVar4 + uVar8;
      uVar5 = *(undefined8 *)(pcVar4->_M_value + 8);
      *(undefined8 *)
       local_68.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start[uVar8]._M_value = *(undefined8 *)pcVar4->_M_value;
      *(undefined8 *)
       ((long)local_68.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8]._M_value + 8) = uVar5;
      uVar8 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar8 < p1->size_);
  }
  if (p2->size_ != 0) {
    uVar6 = 1;
    uVar8 = 0;
    do {
      pcVar4 = (p2->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(p2->coefficients_).
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar4 >> 4) <= uVar8)
         || ((ulong)((long)local_80.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_80.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar8)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pcVar4 = pcVar4 + uVar8;
      uVar5 = *(undefined8 *)(pcVar4->_M_value + 8);
      *(undefined8 *)
       local_80.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start[uVar8]._M_value = *(undefined8 *)pcVar4->_M_value;
      *(undefined8 *)
       ((long)local_80.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8]._M_value + 8) = uVar5;
      uVar8 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar8 < p2->size_);
  }
  if ((long)local_c0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_c0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start != 0x10) {
    uVar8 = 0;
    do {
      uVar9 = 0;
      uVar7 = uVar8;
      do {
        uVar10 = uVar9;
        if (((ulong)((long)local_68.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_68.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar9) ||
           (uVar10 = uVar7,
           (ulong)((long)local_80.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar7)) {
LAB_00105344:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
        }
        local_a8.coefficients_.
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)
              local_68.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar9]._M_value;
        local_a8.coefficients_.
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)local_68.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_value + 8);
        std::complex<double>::operator*=
                  ((complex<double> *)&local_a8,
                   local_80.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar7);
        uVar10 = uVar8;
        if ((ulong)((long)local_c0.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c0.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar8)
        goto LAB_00105344;
        dVar3 = *(double *)
                 (local_c0.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar8]._M_value + 8);
        *(double *)
         local_c0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar8]._M_value =
             (double)local_a8.coefficients_.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
             *(double *)
              local_c0.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8]._M_value;
        *(double *)
         (local_c0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8]._M_value + 8) =
             (double)local_a8.coefficients_.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + dVar3;
        uVar6 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar6;
        uVar7 = (ulong)((int)uVar7 - 1);
      } while (uVar6 <= (uint)uVar8);
      uVar8 = (ulong)((uint)uVar8 + 1);
    } while (uVar8 < ((long)local_c0.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_c0.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U);
  }
  local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_a8.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>,__gnu_cxx::__ops::_Iter_pred<rtb::Filter::multiply<double>(rtb::Filter::Polynomial<double>const&,rtb::Filter::Polynomial<double>const&)::_lambda(std::complex<double>)_1_>>
            (&local_50);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  vector<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,void>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_48,
             (__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
              )local_c0.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start,local_50,&local_c1);
  Polynomial<double>::Polynomial(&local_a8,&local_48);
  if (local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (complex<double> *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            (&__return_storage_ptr__->coefficients_,&local_a8.coefficients_);
  __return_storage_ptr__->order_ = local_a8.order_;
  __return_storage_ptr__->size_ = local_a8.size_;
  if (local_a8.coefficients_.
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.coefficients_.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (complex<double> *)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Polynomial<T> multiply(const Polynomial<T>& p1, const Polynomial<T>& p2) {

            typedef typename Polynomial<T>::Complex Complex;

            size_t resultOrder(p1.getOrder() + p2.getOrder());
            Polynomial<T> result(resultOrder);
            if (resultOrder == 0) {
                result.coefficients_.at(0) = p1.coefficients_.at(0)*p2.coefficients_.at(0);
            }
            else {
                std::vector<Complex> resultCoefficients(2 * resultOrder + 1);
                std::vector<Complex> temp1(2 * resultOrder + 1), temp2(2 * resultOrder + 1);
                for (unsigned i{ 0 }; i < p1.getSize(); ++i)
                    temp1.at(i) = p1.coefficients_.at(i);

                for (unsigned i{ 0 }; i < p2.getSize(); ++i)
                    temp2.at(i) = p2.coefficients_.at(i);

                for (unsigned k{ 0 }; k < resultCoefficients.size() - 1; ++k)
                    for (unsigned i{ 0 }; i <= k; ++i)
                        resultCoefficients.at(k) += temp1.at(i)*temp2.at(k - i);

                auto it = std::find_if(resultCoefficients.rbegin(), resultCoefficients.rend(), [](Complex v){ return std::abs(v) != 0;      });

                Polynomial<T> polyResult(std::vector<Complex>(resultCoefficients.begin(), it.base()));
                result = polyResult;
            }
            return result;
        }